

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrohash128crc.cpp
# Opt level: O0

void metrohash128crc_1(uint8_t *key,uint64_t len,uint32_t seed,uint8_t *out)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  long lVar6;
  long *in_RCX;
  uint in_EDX;
  ulong in_RSI;
  void *in_RDI;
  uint64_t v [4];
  uint8_t *end;
  uint8_t *ptr;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  void *local_98;
  
  local_c8 = ((ulong)in_EDX - 0xc83a91e1) * 0x2f5870a5 + in_RSI;
  local_c0 = ((ulong)in_EDX + 0x8648dbdb) * 0x7bdec03b + in_RSI;
  local_98 = in_RDI;
  if (0x1f < in_RSI) {
    local_b8 = ((ulong)in_EDX + 0xc83a91e1) * 0x7bdec03b + in_RSI;
    local_b0 = ((ulong)in_EDX - 0x8648dbdb) * 0x2f5870a5 + in_RSI;
    do {
      uVar1 = read_u64(local_98);
      uVar2 = crc32(local_c8,uVar1);
      local_c8 = uVar2 ^ local_c8;
      uVar1 = read_u64((void *)((long)local_98 + 8));
      uVar2 = crc32(local_c0,uVar1);
      local_c0 = uVar2 ^ local_c0;
      uVar1 = read_u64((void *)((long)local_98 + 0x10));
      uVar2 = crc32(local_b8,uVar1);
      local_b8 = uVar2 ^ local_b8;
      uVar1 = read_u64((void *)((long)local_98 + 0x18));
      uVar2 = crc32(local_b0,uVar1);
      local_b0 = uVar2 ^ local_b0;
      local_98 = (void *)((long)local_98 + 0x20);
    } while (local_98 <= (void *)((long)in_RDI + (in_RSI - 0x20)));
    uVar1 = rotate_right((local_c8 + local_b0) * 0xc83a91e1 + local_c0,0x22);
    local_b8 = uVar1 * 0x8648dbdb ^ local_b8;
    uVar1 = rotate_right((local_c0 + local_b8) * 0x8648dbdb + local_c8,0x25);
    local_b0 = uVar1 * 0xc83a91e1 ^ local_b0;
    uVar1 = rotate_right((local_c8 + local_b8) * 0xc83a91e1 + local_b0,0x22);
    local_c8 = uVar1 * 0x8648dbdb ^ local_c8;
    uVar1 = rotate_right((local_c0 + local_b0) * 0x8648dbdb + local_b8,0x25);
    local_c0 = uVar1 * 0xc83a91e1 ^ local_c0;
  }
  if (0xf < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u64(local_98);
    uVar1 = rotate_right(uVar1 * 0x7bdec03b + local_c8,0x22);
    uVar3 = read_u64((void *)((long)local_98 + 8));
    local_98 = (void *)((long)local_98 + 0x10);
    uVar3 = rotate_right(uVar3 * 0x7bdec03b + local_c0,0x22);
    uVar4 = rotate_right(uVar1 * 0x16e8b05e33f3b607 + uVar3 * 0x2f5870a5,0x1e);
    local_c8 = uVar4 * 0x8648dbdb ^ uVar1 * 0x2f5870a5;
    uVar1 = rotate_right(uVar3 * 0x8c197ea3900ca59 + local_c8,0x1e);
    local_c0 = uVar1 * 0xc83a91e1 ^ uVar3 * 0x2f5870a5;
  }
  if (7 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u64(local_98);
    local_98 = (void *)((long)local_98 + 8);
    uVar1 = rotate_right(uVar1 * 0x7bdec03b + local_c8,0x24);
    uVar3 = rotate_right(uVar1 * 0x16e8b05e33f3b607 + local_c0,0x17);
    local_c8 = uVar3 * 0x8648dbdb ^ uVar1 * 0x2f5870a5;
  }
  if (3 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u32(local_98);
    uVar2 = crc32(local_c8,uVar1);
    local_98 = (void *)((long)local_98 + 4);
    uVar1 = rotate_right((uVar2 ^ local_c0) * 0x2f5870a5 + local_c8,0x13);
    local_c0 = uVar1 * 0xc83a91e1 ^ uVar2 ^ local_c0;
  }
  if (1 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u16(local_98);
    uVar2 = crc32(local_c0,uVar1);
    local_98 = (void *)((long)local_98 + 2);
    uVar1 = rotate_right((uVar2 ^ local_c8) * 0x7bdec03b + local_c0,0xd);
    local_c8 = uVar1 * 0x8648dbdb ^ uVar2 ^ local_c8;
  }
  if (0 < (long)((long)in_RDI + (in_RSI - (long)local_98))) {
    uVar1 = read_u8(local_98);
    uVar2 = crc32(local_c8,uVar1);
    uVar1 = rotate_right((uVar2 ^ local_c0) * 0x2f5870a5 + local_c8,0x11);
    local_c0 = uVar1 * 0xc83a91e1 ^ uVar2 ^ local_c0;
  }
  uVar1 = rotate_right(local_c8 * 0xc83a91e1 + local_c0,0xb);
  lVar5 = uVar1 + local_c8;
  uVar1 = rotate_right(local_c0 * 0x8648dbdb + lVar5,0x1a);
  lVar6 = uVar1 + local_c0;
  uVar1 = rotate_right(lVar5 * 0xc83a91e1 + lVar6,0xb);
  uVar3 = rotate_right(lVar6 * 0x8648dbdb + uVar1 + lVar5,0x1a);
  *in_RCX = uVar1 + lVar5;
  in_RCX[1] = uVar3 + lVar6;
  return;
}

Assistant:

void metrohash128crc_1(const uint8_t * key, uint64_t len, uint32_t seed, uint8_t * out)
{
    static const uint64_t k0 = 0xC83A91E1;
    static const uint64_t k1 = 0x8648DBDB;
    static const uint64_t k2 = 0x7BDEC03B;
    static const uint64_t k3 = 0x2F5870A5;

    const uint8_t * ptr = reinterpret_cast<const uint8_t*>(key);
    const uint8_t * const end = ptr + len;
    
    uint64_t v[4];
    
    v[0] = ((static_cast<uint64_t>(seed) - k0) * k3) + len;
    v[1] = ((static_cast<uint64_t>(seed) + k1) * k2) + len;
    
    if (len >= 32)
    {        
        v[2] = ((static_cast<uint64_t>(seed) + k0) * k2) + len;
        v[3] = ((static_cast<uint64_t>(seed) - k1) * k3) + len;

        do
        {
            v[0] ^= _mm_crc32_u64(v[0], read_u64(ptr)); ptr += 8;
            v[1] ^= _mm_crc32_u64(v[1], read_u64(ptr)); ptr += 8;
            v[2] ^= _mm_crc32_u64(v[2], read_u64(ptr)); ptr += 8;
            v[3] ^= _mm_crc32_u64(v[3], read_u64(ptr)); ptr += 8;
        }
        while (ptr <= (end - 32));

        v[2] ^= rotate_right(((v[0] + v[3]) * k0) + v[1], 34) * k1;
        v[3] ^= rotate_right(((v[1] + v[2]) * k1) + v[0], 37) * k0;
        v[0] ^= rotate_right(((v[0] + v[2]) * k0) + v[3], 34) * k1;
        v[1] ^= rotate_right(((v[1] + v[3]) * k1) + v[2], 37) * k0;
    }
    
    if ((end - ptr) >= 16)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],34) * k3;
        v[1] += read_u64(ptr) * k2; ptr += 8; v[1] = rotate_right(v[1],34) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 30) * k1;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 30) * k0;
    }
    
    if ((end - ptr) >= 8)
    {
        v[0] += read_u64(ptr) * k2; ptr += 8; v[0] = rotate_right(v[0],36) * k3;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 23) * k1;
    }
    
    if ((end - ptr) >= 4)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u32(ptr)); ptr += 4;
        v[1] ^= rotate_right((v[1] * k3) + v[0], 19) * k0;
    }
    
    if ((end - ptr) >= 2)
    {
        v[0] ^= _mm_crc32_u64(v[1], read_u16(ptr)); ptr += 2;
        v[0] ^= rotate_right((v[0] * k2) + v[1], 13) * k1;
    }
    
    if ((end - ptr) >= 1)
    {
        v[1] ^= _mm_crc32_u64(v[0], read_u8 (ptr));
        v[1] ^= rotate_right((v[1] * k3) + v[0], 17) * k0;
    }
    
    v[0] += rotate_right((v[0] * k0) + v[1], 11);
    v[1] += rotate_right((v[1] * k1) + v[0], 26);
    v[0] += rotate_right((v[0] * k0) + v[1], 11);
    v[1] += rotate_right((v[1] * k1) + v[0], 26);

    memcpy(out, v, 16);
}